

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

void __thiscall basisu::basisu_frontend::generate_block_endpoint_clusters(basisu_frontend *this)

{
  vector<basisu::vec2U> *this_00;
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  vector<unsigned_int> *this_01;
  uint *puVar4;
  vec2U *pvVar5;
  uint32_t *puVar6;
  uint32_t cluster_indices_iter;
  ulong uVar7;
  int cluster_index;
  size_t i;
  
  this_00 = &this->m_block_endpoint_clusters_indices;
  vector<basisu::vec2U>::resize(this_00,(ulong)this->m_total_blocks,false);
  for (i = 0; (long)i < (long)(int)(this->m_endpoint_clusters).m_size; i = i + 1) {
    this_01 = vector<basisu::vector<unsigned_int>_>::operator[](&this->m_endpoint_clusters,i);
    for (uVar7 = 0; uVar7 < this_01->m_size; uVar7 = uVar7 + 1) {
      puVar4 = vector<unsigned_int>::operator[](this_01,uVar7);
      uVar1 = *puVar4;
      puVar4 = vector<unsigned_int>::operator[](this_01,uVar7);
      uVar2 = *puVar4;
      pvVar5 = vector<basisu::vec2U>::operator[](this_00,(ulong)(uVar1 >> 1));
      puVar6 = vec2U::operator[](pvVar5,uVar2 & 1);
      *puVar6 = (uint32_t)i;
    }
  }
  if ((this->m_params).m_validate == true) {
    uVar7 = 0;
    while (uVar7 < this->m_total_blocks) {
      pvVar5 = vector<basisu::vec2U>::operator[](this_00,uVar7);
      uVar3 = pvVar5->m_comps[0];
      pvVar5 = vector<basisu::vec2U>::operator[](this_00,uVar7);
      uVar7 = uVar7 + 1;
      if (uVar3 != pvVar5->m_comps[1]) {
        handle_verify_failure(0x3e9);
      }
    }
  }
  return;
}

Assistant:

void basisu_frontend::generate_block_endpoint_clusters()
	{
		m_block_endpoint_clusters_indices.resize(m_total_blocks);

		for (int cluster_index = 0; cluster_index < static_cast<int>(m_endpoint_clusters.size()); cluster_index++)
		{
			const basisu::vector<uint32_t>& cluster_indices = m_endpoint_clusters[cluster_index];

			for (uint32_t cluster_indices_iter = 0; cluster_indices_iter < cluster_indices.size(); cluster_indices_iter++)
			{
				const uint32_t block_index = cluster_indices[cluster_indices_iter] >> 1;
				const uint32_t subblock_index = cluster_indices[cluster_indices_iter] & 1;

				m_block_endpoint_clusters_indices[block_index][subblock_index] = cluster_index;

			} // cluster_indices_iter
		}

		if (m_params.m_validate)
		{
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				uint32_t cluster_0 = m_block_endpoint_clusters_indices[block_index][0];
				uint32_t cluster_1 = m_block_endpoint_clusters_indices[block_index][1];
				BASISU_FRONTEND_VERIFY(cluster_0 == cluster_1);
			}
		}
	}